

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O1

void __thiscall QtMWidgets::Stepper::paintEvent(Stepper *this,QPaintEvent *param_1)

{
  long lVar1;
  StepperPrivate *pSVar2;
  int iVar3;
  QBrush *pQVar4;
  int iVar5;
  int iVar6;
  QColor QVar7;
  QPainter p;
  QPainterPath plusButton;
  QPainterPath minusButton;
  QBrush local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  undefined8 uStack_90;
  double local_88;
  double local_80;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  double local_28;
  
  QPainter::QPainter((QPainter *)local_b8,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)(QPainter *)local_b8,true);
  local_98 = (undefined1  [8])0x3ff0000000000000;
  uStack_90 = 1.0;
  QPainter::translate((QPointF *)local_b8);
  lVar1 = *(long *)&this->field_0x20;
  local_58 = (double)(int)(~*(uint *)(lVar1 + 0x14) + *(int *)(lVar1 + 0x1c));
  local_48 = (double)(int)(~*(uint *)(lVar1 + 0x18) + *(int *)(lVar1 + 0x20));
  uStack_40 = 0;
  QPainterPath::QPainterPath((QPainterPath *)local_a8);
  local_98 = (undefined1  [8])(local_58 * 0.5);
  uStack_90 = local_48;
  local_68 = (double)local_98;
  QPainterPath::moveTo((QPointF *)local_a8);
  local_70 = local_58 * 0.2;
  local_98 = (undefined1  [8])(local_70 * 0.5);
  uStack_90 = local_48;
  local_60 = (double)local_98;
  QPainterPath::lineTo((QPointF *)local_a8);
  uStack_90 = local_48 - local_70;
  local_98 = (undefined1  [8])0x0;
  local_88 = local_70;
  local_80 = local_70;
  local_28 = uStack_90;
  QPainterPath::arcTo((QRectF *)local_a8,-90.0,-90.0);
  local_98 = (undefined1  [8])0x0;
  uStack_90 = local_60;
  QPainterPath::lineTo((QPointF *)local_a8);
  local_98 = (undefined1  [8])0x0;
  uStack_90 = 0.0;
  local_88 = local_70;
  local_80 = local_70;
  QPainterPath::arcTo((QRectF *)local_a8,-180.0,-90.0);
  local_98 = (undefined1  [8])local_68;
  uStack_90 = 0.0;
  QPainterPath::lineTo((QPointF *)local_a8);
  QPainterPath::closeSubpath();
  QPainterPath::QPainterPath((QPainterPath *)local_b0);
  local_98 = (undefined1  [8])local_68;
  uStack_90 = 0.0;
  QPainterPath::moveTo((QPointF *)local_b0);
  local_98 = (undefined1  [8])(local_58 - local_60);
  uStack_90 = 0.0;
  QPainterPath::lineTo((QPointF *)local_b0);
  local_98 = (undefined1  [8])(local_58 - local_70);
  uStack_90 = 0.0;
  local_88 = local_70;
  local_80 = local_70;
  local_30 = (double)local_98;
  QPainterPath::arcTo((QRectF *)local_b0,90.0,-90.0);
  uStack_90 = local_48 - local_60;
  local_98 = (undefined1  [8])local_58;
  QPainterPath::lineTo((QPointF *)local_b0);
  local_98 = (undefined1  [8])local_30;
  uStack_90 = local_28;
  local_88 = local_70;
  local_80 = local_70;
  QPainterPath::arcTo((QRectF *)local_b0,0.0,-90.0);
  local_98 = (undefined1  [8])local_68;
  uStack_90 = local_48;
  QPainterPath::lineTo((QPointF *)local_b0);
  QPainterPath::closeSubpath();
  QPainter::setPen((QColor *)local_b8);
  QBrush::QBrush((QBrush *)local_98,white,SolidPattern);
  QPainter::setBrush((QBrush *)local_b8);
  QBrush::~QBrush((QBrush *)local_98);
  QPainter::drawPath((QPainterPath *)local_b8);
  QPainter::drawPath((QPainterPath *)local_b8);
  pSVar2 = (this->d).d;
  if (pSVar2->minusButtonEnabled == false) {
    QVar7 = lighterColor(&pSVar2->color,0x32);
    local_98 = QVar7._0_8_;
    uStack_90._0_6_ = QVar7.ct._4_6_;
    QBrush::QBrush((QBrush *)(local_a8 + 8),(QColor *)local_98,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_c0,local_a8 + 8,1,0x10,0x40);
    QPainter::setPen((QPen *)local_b8);
    QPen::~QPen((QPen *)local_c0);
    pQVar4 = (QBrush *)(local_a8 + 8);
  }
  else {
    QBrush::QBrush(local_c0,&pSVar2->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_98,local_c0,1,0x10,0x40);
    QPainter::setPen((QPen *)local_b8);
    QPen::~QPen((QPen *)local_98);
    pQVar4 = local_c0;
  }
  QBrush::~QBrush(pQVar4);
  iVar5 = (int)((double)((ulong)(local_48 * 0.25) & 0x8000000000000000 | 0x3fe0000000000000) +
               local_48 * 0.25);
  iVar6 = (int)((double)((ulong)(local_58 * 0.25) & 0x8000000000000000 | 0x3fe0000000000000) +
               local_58 * 0.25);
  iVar3 = (int)((double)((ulong)(local_48 * 0.5) & 0x8000000000000000 | 0x3fe0000000000000) +
               local_48 * 0.5);
  local_98._4_4_ = iVar3;
  local_98._0_4_ = iVar6 - iVar5;
  uStack_90 = (double)CONCAT44(iVar3,iVar5 + iVar6);
  QPainter::drawLines((QLine *)local_b8,(int)local_98);
  pSVar2 = (this->d).d;
  if (pSVar2->plusButtonEnabled == false) {
    QVar7 = lighterColor(&pSVar2->color,0x32);
    local_98 = QVar7._0_8_;
    uStack_90._0_6_ = QVar7.ct._4_6_;
    QBrush::QBrush((QBrush *)(local_a8 + 8),(QColor *)local_98,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_c0,local_a8 + 8,1,0x10,0x40);
    QPainter::setPen((QPen *)local_b8);
    QPen::~QPen((QPen *)local_c0);
    pQVar4 = (QBrush *)(local_a8 + 8);
  }
  else {
    QBrush::QBrush(local_c0,&pSVar2->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,local_98,local_c0,1,0x10,0x40);
    QPainter::setPen((QPen *)local_b8);
    QPen::~QPen((QPen *)local_98);
    pQVar4 = local_c0;
  }
  QBrush::~QBrush(pQVar4);
  iVar6 = iVar6 * 3;
  local_98._0_4_ = iVar6 - iVar5;
  uStack_90 = (double)CONCAT44(iVar3,iVar6 + iVar5);
  QPainter::drawLines((QLine *)local_b8,(int)local_98);
  local_98._4_4_ = iVar3 - iVar5;
  local_98._0_4_ = iVar6;
  uStack_90 = (double)CONCAT44(iVar3 + iVar5,iVar6);
  QPainter::drawLines((QLine *)local_b8,(int)local_98);
  QPainterPath::~QPainterPath((QPainterPath *)local_b0);
  QPainterPath::~QPainterPath((QPainterPath *)local_a8);
  QPainter::~QPainter((QPainter *)local_b8);
  return;
}

Assistant:

void
Stepper::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	const qreal width = rect().width() - 2;
	const qreal height = rect().height() - 2;
	const qreal arcSize = width * 0.2;

	QPainterPath minusButton;
	minusButton.moveTo( width / 2.0, height );
	minusButton.lineTo( arcSize / 2.0, height );
	minusButton.arcTo( 0.0, height - arcSize, arcSize, arcSize,
		-90.0, -90.0 );
	minusButton.lineTo( 0.0, arcSize / 2.0 );
	minusButton.arcTo( 0.0, 0.0, arcSize, arcSize, -180.0, -90.0 );
	minusButton.lineTo( width / 2.0, 0.0 );
	minusButton.closeSubpath();

	QPainterPath plusButton;
	plusButton.moveTo( width / 2.0, 0.0 );
	plusButton.lineTo( width - arcSize / 2.0, 0.0 );
	plusButton.arcTo( width - arcSize, 0.0, arcSize, arcSize,
		90.0, -90.0 );
	plusButton.lineTo( width, height - arcSize / 2.0 );
	plusButton.arcTo( width - arcSize, height - arcSize,
		arcSize, arcSize, 0.0, -90.0 );
	plusButton.lineTo( width / 2.0, height );
	plusButton.closeSubpath();

	p.setPen( d->color );
	p.setBrush( Qt::white );

	p.drawPath( minusButton );
	p.drawPath( plusButton );

	const int signSize = qRound( height / 4.0 );
	const int minusCenterX = qRound( width / 4.0 );
	const int centerY = qRound( height / 2.0 );
	const int plusCenterX = minusCenterX * 3;

	if( !d->minusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( minusCenterX - signSize, centerY,
		minusCenterX + signSize, centerY );

	if( !d->plusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( plusCenterX - signSize, centerY,
		plusCenterX + signSize, centerY );
	p.drawLine( plusCenterX, centerY - signSize,
		plusCenterX, centerY + signSize );
}